

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

bool __thiscall S2Polygon::Contains(S2Polygon *this,S2Point *p)

{
  bool bVar1;
  int iVar2;
  __int_type_conflict1 _Var3;
  int iVar4;
  S2Loop *this_00;
  S2ContainsPointQueryOptions local_7c;
  S2ContainsPointQuery<MutableS2ShapeIndex> local_78;
  int local_28;
  bool local_21;
  int i;
  bool inside;
  S2Point *p_local;
  S2Polygon *this_local;
  
  _i = p;
  p_local = (S2Point *)this;
  bVar1 = MutableS2ShapeIndex::is_fresh(&this->index_);
  if (!bVar1) {
    bVar1 = S2LatLngRect::Contains(&this->bound_,_i);
    if (!bVar1) {
      this_local._7_1_ = 0;
      goto LAB_004b94f1;
    }
  }
  iVar2 = num_vertices(this);
  if (iVar2 < 0x21) {
LAB_004b93f0:
    local_21 = false;
    local_28 = 0;
    while( true ) {
      iVar2 = local_28;
      iVar4 = num_loops(this);
      if (iVar4 <= iVar2) break;
      this_00 = loop(this,local_28);
      bVar1 = S2Loop::BruteForceContains(this_00,_i);
      local_21 = (bool)(local_21 & 1U) != bVar1;
      local_28 = local_28 + 1;
    }
    this_local._7_1_ = local_21 & 1;
  }
  else {
    bVar1 = MutableS2ShapeIndex::is_fresh(&this->index_);
    if (!bVar1) {
      _Var3 = std::__atomic_base<int>::operator++
                        (&(this->unindexed_contains_calls_).super___atomic_base<int>);
      if (_Var3 != 0x14) goto LAB_004b93f0;
    }
    S2ContainsPointQueryOptions::S2ContainsPointQueryOptions(&local_7c);
    MakeS2ContainsPointQuery<MutableS2ShapeIndex>(&local_78,&this->index_,&local_7c);
    this_local._7_1_ = S2ContainsPointQuery<MutableS2ShapeIndex>::Contains(&local_78,_i);
    S2ContainsPointQuery<MutableS2ShapeIndex>::~S2ContainsPointQuery(&local_78);
  }
LAB_004b94f1:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool S2Polygon::Contains(const S2Point& p) const {
  // NOTE(ericv): A bounds check slows down this function by about 50%.  It is
  // worthwhile only when it might allow us to delay building the index.
  if (!index_.is_fresh() && !bound_.Contains(p)) return false;

  // For small polygons it is faster to just check all the crossings.
  // Otherwise we keep track of the number of calls to Contains() and only
  // build the index once enough calls have been made so that we think it is
  // worth the effort.  See S2Loop::Contains(S2Point) for detailed comments.
  static const int kMaxBruteForceVertices = 32;
  static const int kMaxUnindexedContainsCalls = 20;
  if (num_vertices() <= kMaxBruteForceVertices ||
      (!index_.is_fresh() &&
       ++unindexed_contains_calls_ != kMaxUnindexedContainsCalls)) {
    bool inside = false;
    for (int i = 0; i < num_loops(); ++i) {
      // Use brute force to avoid building the loop's S2ShapeIndex.
      inside ^= loop(i)->BruteForceContains(p);
    }
    return inside;
  }
  // Otherwise we look up the S2ShapeIndex cell containing this point.
  return MakeS2ContainsPointQuery(&index_).Contains(p);
}